

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

u32 dec_parse_abs_mvd(com_lbac_t *lbac,lbac_ctx_model_t *model)

{
  byte bVar1;
  byte bVar2;
  u32 uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  bool bVar9;
  u8 *local_c8;
  u8 *local_b8;
  int golomb_order;
  int add_one;
  u32 act_sym;
  lbac_ctx_model_t *model_local;
  com_lbac_t *lbac_local;
  s32 lps_mask;
  s32 scaled_rMPS;
  s32 low;
  s32 range;
  u32 bin;
  u32 val;
  int i;
  int x;
  int bin_1;
  s32 lps_mask_1;
  s32 scaled_rMPS_1;
  s32 low_1;
  s32 range_1;
  u32 val_1;
  int bins;
  int i_1;
  int x_1;
  
  uVar3 = lbac_dec_bin(lbac,model);
  if (uVar3 == 0) {
    golomb_order = 0;
  }
  else {
    uVar3 = lbac_dec_bin(lbac,model + 1);
    if (uVar3 == 0) {
      golomb_order = 1;
    }
    else {
      uVar3 = lbac_dec_bin(lbac,model + 2);
      if (uVar3 == 0) {
        golomb_order = 2;
      }
      else {
        uVar3 = lbac_dec_bin_ep(lbac);
        range = 0;
        lps_mask = lbac->low;
        uVar4 = lbac->range * 0x10000;
        do {
          iVar5 = uVar4 - lps_mask;
          uVar7 = (uint)((iVar5 < 0 ^ 0xffU) & 1);
          lps_mask = (lps_mask - (uVar4 & iVar5 >> 0x1f)) * 2;
          if ((lps_mask & 0xffffU) == 0) {
            uVar6 = (int)(lps_mask ^ lps_mask - 1U) >> 0xf;
            iVar5 = 0x1f;
            if (uVar6 != 0) {
              for (; uVar6 >> iVar5 == 0; iVar5 = iVar5 + -1) {
              }
            }
            bVar8 = *lbac->cur;
            bVar1 = lbac->cur[1];
            if (lbac->cur + 2 < lbac->end) {
              local_b8 = lbac->cur + 2;
            }
            else {
              local_b8 = lbac->end;
            }
            lbac->cur = local_b8;
            lps_mask = lps_mask +
                       ((uint)bVar8 * 0x200 + (uint)bVar1 * 2 + -0xffff <<
                       (7 - (((byte)iVar5 ^ 0x1f) - 0x17) & 0x1f));
          }
          range = uVar7 + range;
          bVar9 = false;
          if (uVar7 != 0) {
            bVar9 = lbac->cur < lbac->end;
          }
        } while (bVar9);
        lbac->range = lbac->range;
        lbac->low = lps_mask;
        bVar8 = (byte)range;
        low_1 = 0;
        lps_mask_1 = lbac->low;
        uVar4 = lbac->range * 0x10000;
        while (range_1 = range + -1, -1 < range_1) {
          uVar7 = (int)(uVar4 - lps_mask_1) >> 0x1f;
          lps_mask_1 = (lps_mask_1 - (uVar4 & uVar7)) * 2;
          if ((lps_mask_1 & 0xffffU) == 0) {
            uVar6 = (int)(lps_mask_1 ^ lps_mask_1 - 1U) >> 0xf;
            iVar5 = 0x1f;
            if (uVar6 != 0) {
              for (; uVar6 >> iVar5 == 0; iVar5 = iVar5 + -1) {
              }
            }
            bVar1 = *lbac->cur;
            bVar2 = lbac->cur[1];
            if (lbac->cur + 2 < lbac->end) {
              local_c8 = lbac->cur + 2;
            }
            else {
              local_c8 = lbac->end;
            }
            lbac->cur = local_c8;
            lps_mask_1 = lps_mask_1 +
                         ((uint)bVar1 * 0x200 + (uint)bVar2 * 2 + -0xffff <<
                         (7 - (((byte)iVar5 ^ 0x1f) - 0x17) & 0x1f));
          }
          low_1 = low_1 << 1 | uVar7 & 1;
          range = range_1;
        }
        lbac->range = lbac->range;
        lbac->low = lps_mask_1;
        golomb_order = ((1 << (bVar8 & 0x1f)) + -1 + low_1) * 2 + 3 + (uVar3 & 1);
      }
    }
  }
  return golomb_order;
}

Assistant:

static u32 dec_parse_abs_mvd(com_lbac_t *lbac, lbac_ctx_model_t *model)
{
    u32 act_sym;

    if (!lbac_dec_bin(lbac, model)) {
        act_sym = 0;
    } else if (!lbac_dec_bin(lbac, model + 1)) {
        act_sym = 1;
    } else if (!lbac_dec_bin(lbac, model + 2)) {
        act_sym = 2;
    } else {
        int add_one = lbac_dec_bin_ep(lbac) & 1;
        int golomb_order = lbac_read_unary_sym_ep(lbac);
        act_sym = (1 << golomb_order) - 1 + lbac_read_bins_ep_msb(lbac, golomb_order);
        act_sym = 3 + act_sym * 2 + add_one;
    }

    return act_sym;
}